

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool hypergeometric_check(int n,int m,int l)

{
  int l_local;
  int m_local;
  int n_local;
  
  if ((n < 0) || (l < n)) {
    std::operator<<((ostream *)&std::cout," \n");
    std::operator<<((ostream *)&std::cout,"HYPERGEOMETRIC_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cout,"  Input N is out of range.\n");
    m_local._3_1_ = false;
  }
  else if ((m < 0) || (l < m)) {
    std::operator<<((ostream *)&std::cout," \n");
    std::operator<<((ostream *)&std::cout,"HYPERGEOMETRIC_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cout,"  Input M is out of range.\n");
    m_local._3_1_ = false;
  }
  else if (l < 0) {
    std::operator<<((ostream *)&std::cout," \n");
    std::operator<<((ostream *)&std::cout,"HYPERGEOMETRIC_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cout,"  Input L is out of range.\n");
    m_local._3_1_ = false;
  }
  else {
    m_local._3_1_ = true;
  }
  return m_local._3_1_;
}

Assistant:

bool hypergeometric_check ( int n, int m, int l )

//****************************************************************************80
//
//  Purpose:
//
//    HYPERGEOMETRIC_CHECK checks the parameters of the Hypergeometric CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of balls selected.
//    0 <= N <= L.
//
//    Input, int M, the number of white balls in the population.
//    0 <= M <= L.
//
//    Input, int L, the number of balls to select from.
//    0 <= L.
//
//    Output, bool HYPERGEOMETRIC_CHECK, is true if the parameters are legal.
//
{
  if ( n < 0 || l < n )
  {
    cout << " \n";
    cout << "HYPERGEOMETRIC_CHECK - Warning!\n";
    cout << "  Input N is out of range.\n";
    return false;
  }

  if ( m < 0 || l < m )
  {
    cout << " \n";
    cout << "HYPERGEOMETRIC_CHECK - Warning!\n";
    cout << "  Input M is out of range.\n";
    return false;
  }

  if ( l < 0 )
  {
    cout << " \n";
    cout << "HYPERGEOMETRIC_CHECK - Warning!\n";
    cout << "  Input L is out of range.\n";
    return false;
  }

  return true;
}